

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSpeedup.c
# Opt level: O3

Abc_Ntk_t *
Abc_NtkSpeedup(Abc_Ntk_t *pNtk,int fUseLutLib,int Percentage,int Degree,int fVerbose,
              int fVeryVerbose)

{
  float *pfVar1;
  Abc_Obj_t *pAVar2;
  long *plVar3;
  void *pvVar4;
  undefined8 *puVar5;
  Abc_NtkType_t AVar6;
  uint uVar7;
  void *__ptr;
  Vec_Ptr_t *vTimes;
  void **ppvVar8;
  Abc_Ntk_t *pNtk_00;
  ulong uVar9;
  Vec_Ptr_t *pVVar10;
  long lVar11;
  long lVar12;
  long *plVar13;
  ulong uVar14;
  long *plVar15;
  uint uVar16;
  Abc_NtkFunc_t AVar17;
  long lVar18;
  long lVar19;
  uint uVar20;
  char *pcVar21;
  Abc_Ntk_t *pAVar22;
  Abc_NtkFunc_t AVar23;
  int iVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  float fVar28;
  float tDelta;
  ulong local_70;
  int local_68;
  ulong local_60;
  
  fVar28 = Abc_NtkDelayTraceLut(pNtk,fUseLutLib);
  if (fUseLutLib == 0) {
    tDelta = 1.0;
  }
  else {
    tDelta = ((float)Percentage * fVar28) / 100.0;
  }
  if (fVerbose != 0) {
    printf("Max delay = %.2f. Delta = %.2f. ",(double)fVar28,(double)tDelta);
    pcVar21 = "LUT library";
    if (fUseLutLib == 0) {
      pcVar21 = "unit-delay";
    }
    printf("Using %s model. ",pcVar21);
    if (fUseLutLib != 0) {
      printf("Percentage = %d. ",(ulong)(uint)Percentage);
    }
    putchar(10);
  }
  pVVar10 = pNtk->vObjs;
  uVar7 = pVVar10->nSize;
  pAVar22 = (Abc_Ntk_t *)0x1;
  __ptr = calloc(1,(long)(int)uVar7 * 4);
  if (0 < (long)(int)uVar7) {
    lVar26 = 0;
    do {
      pAVar2 = (Abc_Obj_t *)pVVar10->pArray[lVar26];
      if (((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) &&
         (pAVar2->pNtk->pLutTimes[(long)pAVar2->Id * 3 + 2] < tDelta)) {
        uVar7 = Abc_NtkDelayTraceTCEdges(pAVar22,pAVar2,tDelta,fUseLutLib);
        *(uint *)((long)__ptr + (long)pAVar2->Id * 4) = uVar7;
        pVVar10 = pNtk->vObjs;
      }
      lVar26 = lVar26 + 1;
      uVar7 = pVVar10->nSize;
    } while (lVar26 < (int)uVar7);
  }
  if (fVerbose != 0) {
    if ((int)uVar7 < 1) {
      uVar16 = 0;
      iVar24 = 0;
    }
    else {
      uVar14 = 0;
      iVar24 = 0;
      uVar16 = 0;
      do {
        plVar3 = (long *)pVVar10->pArray[uVar14];
        if ((plVar3 != (long *)0x0) && ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 7)) {
          if (0 < (long)*(int *)((long)plVar3 + 0x1c)) {
            lVar26 = 0;
            do {
              plVar15 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                  (long)*(int *)(plVar3[4] + lVar26 * 4) * 8);
              uVar20 = *(uint *)((long)plVar15 + 0x14) & 0xf;
              if (((uVar20 != 2) && (uVar20 != 5)) &&
                 (pfVar1 = (float *)(*(long *)(*plVar15 + 400) + 8 + (long)(int)plVar15[2] * 0xc),
                 *pfVar1 <= tDelta && tDelta != *pfVar1)) {
                uVar16 = uVar16 + 1;
              }
              lVar26 = lVar26 + 1;
            } while (*(int *)((long)plVar3 + 0x1c) != lVar26);
          }
          uVar20 = *(uint *)((long)__ptr + (long)(int)plVar3[2] * 4);
          uVar20 = (uVar20 >> 1 & 0x55555555) + (uVar20 & 0x55555555);
          uVar20 = (uVar20 >> 2 & 0x33333333) + (uVar20 & 0x33333333);
          uVar20 = (uVar20 >> 4 & 0x7070707) + (uVar20 & 0x7070707);
          uVar20 = (uVar20 >> 8 & 0xf000f) + (uVar20 & 0xf000f);
          iVar24 = (uVar20 >> 0x10) + iVar24 + (uVar20 & 0xffff);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar7);
    }
    uVar7 = Abc_NtkGetTotalFanins(pNtk);
    printf("Edges: Total = %7d. 0-slack = %7d. Critical = %7d. Ratio = %4.2f\n",
           (double)iVar24 / (double)(int)uVar16,(ulong)uVar7,(ulong)uVar16);
  }
  pAVar22 = Abc_NtkStrash(pNtk,0,1,0);
  vTimes = (Vec_Ptr_t *)malloc(0x10);
  vTimes->nCap = 0x10;
  ppvVar8 = (void **)malloc(0x80);
  vTimes->pArray = ppvVar8;
  pNtk_00 = (Abc_Ntk_t *)malloc(0x10);
  local_70 = 0x10;
  pNtk_00->ntkType = 0x10;
  pcVar21 = (char *)malloc(0x80);
  pNtk_00->pName = pcVar21;
  pVVar10 = pNtk->vObjs;
  if (pVVar10->nSize < 1) {
    uVar14 = 0;
    local_68 = 0;
  }
  else {
    local_60 = 0x10;
    uVar14 = 0x10;
    lVar26 = 0;
    local_68 = 0;
    uVar7 = 0;
    do {
      pAVar2 = (Abc_Obj_t *)pVVar10->pArray[lVar26];
      if ((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) {
        if (pAVar2->pNtk->pLutTimes[(long)pAVar2->Id * 3 + 2] < tDelta) {
          iVar24 = (pAVar2->vFanins).nSize;
          uVar9 = (ulong)iVar24;
          if ((long)uVar9 < 1) {
            uVar27 = 0;
          }
          else {
            uVar25 = 0;
            uVar27 = 0;
            do {
              uVar16 = *(uint *)((long)pAVar2->pNtk->vObjs->pArray[(pAVar2->vFanins).pArray[uVar25]]
                                + 0x14) & 0xf;
              if ((uVar16 != 2) && (uVar16 != 5)) {
                uVar27 = (ulong)((int)uVar27 +
                                (uint)((*(uint *)((long)__ptr + (long)pAVar2->Id * 4) >>
                                        ((uint)uVar25 & 0x1f) & 1) != 0));
              }
              uVar25 = uVar25 + 1;
            } while (uVar9 != uVar25);
          }
          if (fVeryVerbose != 0 || (int)uVar27 != 0) {
            uVar7 = uVar7 + 1;
            vTimes->nSize = 0;
            if (((int)uVar27 != 0) && (0 < iVar24)) {
              uVar16 = 0;
              lVar18 = 0;
              do {
                plVar3 = (long *)pAVar2->pNtk->vObjs->pArray[(pAVar2->vFanins).pArray[lVar18]];
                uVar20 = *(uint *)((long)plVar3 + 0x14) & 0xf;
                if ((((uVar20 != 2) && (uVar20 != 5)) &&
                    ((*(uint *)((long)__ptr + (long)pAVar2->Id * 4) >> ((uint)lVar18 & 0x1f) & 1) !=
                     0)) && (iVar24 = *(int *)((long)plVar3 + 0x1c), 0 < iVar24)) {
                  lVar19 = 0;
                  do {
                    if ((*(uint *)((long)__ptr + (long)(int)plVar3[2] * 4) >> ((uint)lVar19 & 0x1f)
                        & 1) != 0) {
                      pvVar4 = *(void **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                         (long)*(int *)(plVar3[4] + lVar19 * 4) * 8);
                      if (0 < (int)uVar16) {
                        uVar9 = 0;
                        do {
                          if (vTimes->pArray[uVar9] == pvVar4) goto LAB_003133f0;
                          uVar9 = uVar9 + 1;
                        } while (uVar16 != uVar9);
                      }
                      uVar20 = (uint)uVar14;
                      if (uVar16 == uVar20) {
                        if ((int)uVar20 < 0x10) {
                          if (vTimes->pArray == (void **)0x0) {
                            ppvVar8 = (void **)malloc(0x80);
                          }
                          else {
                            ppvVar8 = (void **)realloc(vTimes->pArray,0x80);
                          }
                          vTimes->pArray = ppvVar8;
                          vTimes->nCap = 0x10;
                          uVar14 = 0x10;
                        }
                        else {
                          uVar14 = (ulong)(uVar20 * 2);
                          if (vTimes->pArray == (void **)0x0) {
                            ppvVar8 = (void **)malloc(uVar14 * 8);
                          }
                          else {
                            ppvVar8 = (void **)realloc(vTimes->pArray,uVar14 * 8);
                          }
                          vTimes->pArray = ppvVar8;
                          vTimes->nCap = uVar20 * 2;
                        }
                      }
                      else {
                        ppvVar8 = vTimes->pArray;
                      }
                      lVar11 = (long)(int)uVar16;
                      uVar16 = uVar16 + 1;
                      vTimes->nSize = uVar16;
                      ppvVar8[lVar11] = pvVar4;
                      iVar24 = *(int *)((long)plVar3 + 0x1c);
                    }
LAB_003133f0:
                    lVar19 = lVar19 + 1;
                  } while (lVar19 < iVar24);
                  uVar9 = (ulong)(uint)(pAVar2->vFanins).nSize;
                }
                lVar18 = lVar18 + 1;
              } while (lVar18 < (int)uVar9);
              if ((int)uVar16 <= Degree && uVar16 != 0) {
                pNtk_00->ntkFunc = ABC_FUNC_NONE;
                if ((int)uVar9 < 1) {
                  AVar17 = ABC_FUNC_NONE;
                }
                else {
                  AVar17 = ABC_FUNC_NONE;
                  lVar18 = 0;
                  do {
                    plVar3 = (long *)pAVar2->pNtk->vObjs->pArray[(pAVar2->vFanins).pArray[lVar18]];
                    uVar20 = *(uint *)((long)plVar3 + 0x14) & 0xf;
                    if ((uVar20 == 2) || (uVar20 == 5)) {
                      if (0 < (int)AVar17) {
                        uVar9 = 0;
                        do {
                          if (*(long **)(pNtk_00->pName + uVar9 * 8) == plVar3) goto LAB_00313650;
                          uVar9 = uVar9 + 1;
                        } while (AVar17 != uVar9);
                      }
                      AVar23 = (Abc_NtkFunc_t)local_60;
                      if (AVar17 == AVar23) {
                        if ((int)AVar23 < 0x10) {
                          if (pNtk_00->pName == (char *)0x0) {
                            pcVar21 = (char *)malloc(0x80);
                          }
                          else {
                            pcVar21 = (char *)realloc(pNtk_00->pName,0x80);
                          }
                          pNtk_00->pName = pcVar21;
                          pNtk_00->ntkType = 0x10;
                          local_70 = 0x10;
                          local_60 = 0x10;
                        }
                        else {
                          AVar6 = AVar23 * 2;
                          local_60 = (ulong)AVar6;
                          if (pNtk_00->pName == (char *)0x0) {
                            pcVar21 = (char *)malloc(local_60 * 8);
                          }
                          else {
                            pcVar21 = (char *)realloc(pNtk_00->pName,local_60 * 8);
                          }
                          pNtk_00->pName = pcVar21;
                          pNtk_00->ntkType = AVar6;
                          local_70 = (ulong)AVar6;
                        }
                      }
                      else {
                        pcVar21 = pNtk_00->pName;
                      }
                      lVar19 = (long)(int)AVar17;
                      AVar17 = AVar17 + ABC_FUNC_SOP;
                      pNtk_00->ntkFunc = AVar17;
                      *(long **)(pcVar21 + lVar19 * 8) = plVar3;
                    }
                    else {
                      iVar24 = *(int *)((long)plVar3 + 0x1c);
                      if (0 < iVar24) {
                        lVar19 = 0;
                        do {
                          lVar11 = *(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                            (long)*(int *)(plVar3[4] + lVar19 * 4) * 8);
                          if (0 < (int)AVar17) {
                            uVar9 = 0;
                            do {
                              if (*(long *)(pNtk_00->pName + uVar9 * 8) == lVar11)
                              goto LAB_003135b9;
                              uVar9 = uVar9 + 1;
                            } while (AVar17 != uVar9);
                          }
                          AVar23 = (Abc_NtkFunc_t)local_70;
                          if (AVar17 == AVar23) {
                            if ((int)AVar23 < 0x10) {
                              if (pNtk_00->pName == (char *)0x0) {
                                pcVar21 = (char *)malloc(0x80);
                              }
                              else {
                                pcVar21 = (char *)realloc(pNtk_00->pName,0x80);
                              }
                              pNtk_00->pName = pcVar21;
                              pNtk_00->ntkType = 0x10;
                              local_70 = 0x10;
                            }
                            else {
                              local_70 = (ulong)(AVar23 * 2);
                              if (pNtk_00->pName == (char *)0x0) {
                                pcVar21 = (char *)malloc(local_70 * 8);
                              }
                              else {
                                pcVar21 = (char *)realloc(pNtk_00->pName,local_70 * 8);
                              }
                              pNtk_00->pName = pcVar21;
                              pNtk_00->ntkType = AVar23 * 2;
                            }
                          }
                          else {
                            pcVar21 = pNtk_00->pName;
                          }
                          lVar12 = (long)(int)AVar17;
                          AVar17 = AVar17 + ABC_FUNC_SOP;
                          *(long *)(pcVar21 + lVar12 * 8) = lVar11;
                          iVar24 = *(int *)((long)plVar3 + 0x1c);
                          local_60 = local_70;
LAB_003135b9:
                          lVar19 = lVar19 + 1;
                        } while (lVar19 < iVar24);
                        pNtk_00->ntkFunc = AVar17;
                      }
                    }
LAB_00313650:
                    lVar18 = lVar18 + 1;
                  } while (lVar18 < (pAVar2->vFanins).nSize);
                }
                if (fVeryVerbose != 0) {
                  printf("%5d Node %5d : %d %2d %2d  ",(ulong)uVar7,(ulong)(uint)pAVar2->Id,uVar27,
                         (ulong)uVar16,(ulong)AVar17);
                  if (0 < (pAVar2->vFanins).nSize) {
                    lVar18 = 0;
                    do {
                      plVar3 = (long *)pAVar2->pNtk->vObjs->pArray[(pAVar2->vFanins).pArray[lVar18]]
                      ;
                      lVar19 = (long)(int)plVar3[2];
                      pcVar21 = "*";
                      if ((*(uint *)((long)__ptr + (long)pAVar2->Id * 4) >> ((uint)lVar18 & 0x1f) &
                          1) == 0) {
                        pcVar21 = "";
                      }
                      printf("%d(%.2f)%s ",
                             (double)*(float *)(*(long *)(*plVar3 + 400) + 8 + lVar19 * 0xc),lVar19,
                             pcVar21);
                      lVar18 = lVar18 + 1;
                    } while (lVar18 < (pAVar2->vFanins).nSize);
                  }
                  putchar(10);
                }
                if (1 < (int)uVar16) {
                  ppvVar8 = vTimes->pArray;
                  plVar3 = (long *)*ppvVar8;
                  plVar15 = (long *)ppvVar8[1];
                  fVar28 = *(float *)(*(long *)(*plVar15 + 400) + 8 + (long)(int)plVar15[2] * 0xc);
                  pfVar1 = (float *)(*(long *)(*plVar3 + 400) + 8 + (long)(int)plVar3[2] * 0xc);
                  plVar13 = plVar3;
                  if (*pfVar1 <= fVar28 && fVar28 != *pfVar1) {
                    *ppvVar8 = plVar15;
                    ppvVar8[1] = plVar3;
                    plVar13 = plVar15;
                    plVar15 = plVar3;
                  }
                  if (uVar16 != 2) {
                    plVar3 = (long *)ppvVar8[2];
                    lVar19 = (long)(int)plVar15[2];
                    lVar18 = *(long *)(*plVar15 + 400);
                    lVar11 = plVar3[2];
                    fVar28 = *(float *)(*(long *)(*plVar3 + 400) + 8 + (long)(int)lVar11 * 0xc);
                    pfVar1 = (float *)(lVar18 + 8 + lVar19 * 0xc);
                    if (*pfVar1 <= fVar28 && fVar28 != *pfVar1) {
                      ppvVar8[1] = plVar3;
                      ppvVar8[2] = plVar15;
                      lVar18 = *(long *)(*plVar3 + 400);
                      plVar15 = plVar3;
                      lVar19 = (long)(int)lVar11;
                    }
                    fVar28 = *(float *)(lVar18 + 8 + lVar19 * 0xc);
                    pfVar1 = (float *)(*(long *)(*plVar13 + 400) + 8 + (long)(int)plVar13[2] * 0xc);
                    if (*pfVar1 <= fVar28 && fVar28 != *pfVar1) {
                      *ppvVar8 = plVar15;
                      ppvVar8[1] = plVar13;
                    }
                  }
                }
                local_68 = local_68 + 1;
                Abc_NtkSpeedupNode(pNtk_00,pAVar22,pAVar2,(Vec_Ptr_t *)pNtk_00,vTimes);
              }
            }
          }
        }
      }
      lVar26 = lVar26 + 1;
      pVVar10 = pNtk->vObjs;
    } while (lVar26 < pVVar10->nSize);
    uVar14 = (ulong)uVar7;
    ppvVar8 = vTimes->pArray;
  }
  if (ppvVar8 != (void **)0x0) {
    free(ppvVar8);
  }
  free(vTimes);
  if (pNtk_00->pName != (char *)0x0) {
    free(pNtk_00->pName);
  }
  free(pNtk_00);
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  if (fVerbose != 0) {
    printf("Nodes: Total = %7d. 0-slack = %7d. Workable = %7d. Ratio = %4.2f\n",
           (double)local_68 / (double)(int)uVar14,(ulong)(uint)pNtk->nObjCounts[7],uVar14);
  }
  pVVar10 = pAVar22->vObjs;
  if (0 < pVVar10->nSize) {
    lVar26 = 0;
    do {
      puVar5 = (undefined8 *)pVVar10->pArray[lVar26];
      if (puVar5 != (undefined8 *)0x0) {
        if (((ulong)puVar5 & 1) != 0) {
          pcVar21 = "!Abc_ObjIsComplement(pNode)";
LAB_0031398c:
          __assert_fail(pcVar21,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                        ,399,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
        }
        if (*(int *)*puVar5 != 3) {
          pcVar21 = "Abc_NtkIsStrash(pNode->pNtk)";
          goto LAB_0031398c;
        }
        if (((*(int *)((long)puVar5 + 0x1c) == 2) && (puVar5[7] != 0)) &&
           (0 < *(int *)(puVar5[7] + 0x2c))) {
          puVar5[7] = 0;
          pVVar10 = pAVar22->vObjs;
        }
      }
      lVar26 = lVar26 + 1;
    } while (lVar26 < pVVar10->nSize);
  }
  return pAVar22;
}

Assistant:

Abc_Ntk_t * Abc_NtkSpeedup( Abc_Ntk_t * pNtk, int fUseLutLib, int Percentage, int Degree, int fVerbose, int fVeryVerbose )
{
    Abc_Ntk_t * pNtkNew;
    Vec_Ptr_t * vTimeCries, * vTimeFanins;
    Abc_Obj_t * pNode, * pFanin, * pFanin2;
    float tDelta, tArrival;
    int i, k, k2, Counter, CounterRes, nTimeCris;
    unsigned * puTCEdges;
    // perform delay trace
    tArrival = Abc_NtkDelayTraceLut( pNtk, fUseLutLib );
    tDelta = fUseLutLib ? tArrival*Percentage/100.0 : 1.0;
    if ( fVerbose )
    {
        printf( "Max delay = %.2f. Delta = %.2f. ", tArrival, tDelta );
        printf( "Using %s model. ", fUseLutLib? "LUT library" : "unit-delay" );
        if ( fUseLutLib )
            printf( "Percentage = %d. ", Percentage );
        printf( "\n" );
    }
    // mark the timing critical nodes and edges
    puTCEdges = ABC_ALLOC( unsigned, Abc_NtkObjNumMax(pNtk) );
    memset( puTCEdges, 0, sizeof(unsigned) * Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( Abc_ObjSlack(pNode) >= tDelta )
            continue;
        puTCEdges[pNode->Id] = Abc_NtkDelayTraceTCEdges( pNtk, pNode, tDelta, fUseLutLib );
    }
    if ( fVerbose )
    {
        Counter = CounterRes = 0;
        Abc_NtkForEachNode( pNtk, pNode, i )
        {
            Abc_ObjForEachFanin( pNode, pFanin, k )
                if ( !Abc_ObjIsCi(pFanin) && Abc_ObjSlack(pFanin) < tDelta )
                    Counter++;
            CounterRes += Extra_WordCountOnes( puTCEdges[pNode->Id] );
        }
        printf( "Edges: Total = %7d. 0-slack = %7d. Critical = %7d. Ratio = %4.2f\n", 
            Abc_NtkGetTotalFanins(pNtk), Counter, CounterRes, 1.0*CounterRes/Counter );
    }
    // start the resulting network
    pNtkNew = Abc_NtkStrash( pNtk, 0, 1, 0 );

    // collect nodes to be used for resynthesis
    Counter = CounterRes = 0;
    vTimeCries = Vec_PtrAlloc( 16 );
    vTimeFanins = Vec_PtrAlloc( 16 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( Abc_ObjSlack(pNode) >= tDelta )
            continue;
        // count the number of non-PI timing-critical nodes
        nTimeCris = 0;
        Abc_ObjForEachFanin( pNode, pFanin, k )
            if ( !Abc_ObjIsCi(pFanin) && (puTCEdges[pNode->Id] & (1<<k)) )
                nTimeCris++;
        if ( !fVeryVerbose && nTimeCris == 0 )
            continue;
        Counter++;
        // count the total number of timing critical second-generation nodes
        Vec_PtrClear( vTimeCries );
        if ( nTimeCris )
        {
            Abc_ObjForEachFanin( pNode, pFanin, k )
                if ( !Abc_ObjIsCi(pFanin) && (puTCEdges[pNode->Id] & (1<<k)) )
                    Abc_ObjForEachFanin( pFanin, pFanin2, k2 )
                        if ( puTCEdges[pFanin->Id] & (1<<k2) )
                            Vec_PtrPushUnique( vTimeCries, pFanin2 );
        }
//        if ( !fVeryVerbose && (Vec_PtrSize(vTimeCries) == 0 || Vec_PtrSize(vTimeCries) > Degree) )
        if ( (Vec_PtrSize(vTimeCries) == 0 || Vec_PtrSize(vTimeCries) > Degree) )
            continue;
        CounterRes++;
        // collect second generation nodes
        Vec_PtrClear( vTimeFanins );
        Abc_ObjForEachFanin( pNode, pFanin, k )
        {
            if ( Abc_ObjIsCi(pFanin) )
                Vec_PtrPushUnique( vTimeFanins, pFanin );
            else
                Abc_ObjForEachFanin( pFanin, pFanin2, k2 )
                    Vec_PtrPushUnique( vTimeFanins, pFanin2 );                    
        }
        // print the results
        if ( fVeryVerbose )
        {
        printf( "%5d Node %5d : %d %2d %2d  ", Counter, pNode->Id, 
            nTimeCris, Vec_PtrSize(vTimeCries), Vec_PtrSize(vTimeFanins) );
        Abc_ObjForEachFanin( pNode, pFanin, k )
            printf( "%d(%.2f)%s ", pFanin->Id, Abc_ObjSlack(pFanin), (puTCEdges[pNode->Id] & (1<<k))? "*":"" );
        printf( "\n" );
        }
        // add the node to choices
        if ( Vec_PtrSize(vTimeCries) == 0 || Vec_PtrSize(vTimeCries) > Degree )
            continue;
        // order the fanins in the increasing order of criticalily
        if ( Vec_PtrSize(vTimeCries) > 1 )
        {
            pFanin = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 0 );
            pFanin2 = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 1 );
            if ( Abc_ObjSlack(pFanin) < Abc_ObjSlack(pFanin2) )
            {
                Vec_PtrWriteEntry( vTimeCries, 0, pFanin2 );
                Vec_PtrWriteEntry( vTimeCries, 1, pFanin );
            }
        }
        if ( Vec_PtrSize(vTimeCries) > 2 )
        {
            pFanin = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 1 );
            pFanin2 = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 2 );
            if ( Abc_ObjSlack(pFanin) < Abc_ObjSlack(pFanin2) )
            {
                Vec_PtrWriteEntry( vTimeCries, 1, pFanin2 );
                Vec_PtrWriteEntry( vTimeCries, 2, pFanin );
            }
            pFanin = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 0 );
            pFanin2 = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 1 );
            if ( Abc_ObjSlack(pFanin) < Abc_ObjSlack(pFanin2) )
            {
                Vec_PtrWriteEntry( vTimeCries, 0, pFanin2 );
                Vec_PtrWriteEntry( vTimeCries, 1, pFanin );
            }
        }
        // add choice
        Abc_NtkSpeedupNode( pNtk, pNtkNew, pNode, vTimeFanins, vTimeCries );
    }
    Vec_PtrFree( vTimeCries );
    Vec_PtrFree( vTimeFanins );
    ABC_FREE( puTCEdges );
    if ( fVerbose )
        printf( "Nodes: Total = %7d. 0-slack = %7d. Workable = %7d. Ratio = %4.2f\n", 
            Abc_NtkNodeNum(pNtk), Counter, CounterRes, 1.0*CounterRes/Counter ); 

    // remove invalid choice nodes
    Abc_AigForEachAnd( pNtkNew, pNode, i )
        if ( pNode->pData )
        {
            if ( Abc_ObjFanoutNum((Abc_Obj_t *)pNode->pData) > 0 )
                pNode->pData = NULL;
        }

    // return the result
    return pNtkNew;
}